

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale.cc
# Opt level: O2

void ScalePlaneBilinearUp
               (int src_width,int src_height,int dst_width,int dst_height,int src_stride,
               int dst_stride,uint8_t *src_ptr,uint8_t *dst_ptr,FilterMode filtering)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  code *pcVar4;
  long lVar5;
  uint uVar6;
  undefined1 uVar7;
  ulong uVar8;
  int iVar9;
  uint8_t *puVar10;
  code *pcVar11;
  bool bVar12;
  int y;
  int x;
  ulong local_88;
  int dx;
  uint8_t *local_78;
  long local_70;
  uint8_t *local_68;
  code *local_60;
  int local_54;
  int local_50;
  int dy;
  code *local_48;
  void *local_40;
  uint8_t *local_38;
  
  x = 0;
  y = 0;
  dx = 0;
  dy = 0;
  local_54 = dst_stride;
  ScaleSlope(src_width,src_height,dst_width,dst_height,filtering,&x,&y,&dx,&dy);
  uVar6 = -src_width;
  if (0 < src_width) {
    uVar6 = src_width;
  }
  iVar3 = libyuv::TestCpuFlag(0x40);
  if ((dst_width & 0xfU) == 0) {
    pcVar11 = InterpolateRow_SSSE3;
  }
  else {
    pcVar11 = InterpolateRow_Any_SSSE3;
  }
  if (iVar3 == 0) {
    pcVar11 = InterpolateRow_C;
  }
  local_88 = (ulong)(uint)dst_width;
  iVar3 = libyuv::TestCpuFlag(0x400);
  if ((local_88 & 0x1f) == 0) {
    local_48 = InterpolateRow_AVX2;
  }
  else {
    local_48 = InterpolateRow_Any_AVX2;
  }
  iVar1 = src_height * 0x10000 + -0x10000;
  if (iVar3 == 0) {
    local_48 = pcVar11;
  }
  if (filtering == kFilterNone) {
    pcVar11 = ScaleCols_C;
    if (x < 0x8000) {
      pcVar11 = ScaleColsUp2_C;
    }
    local_60 = ScaleCols_C;
    if (uVar6 * 2 == (int)local_88) {
      local_60 = pcVar11;
    }
  }
  else {
    if (uVar6 < 0x8000) {
      pcVar11 = ScaleFilterCols_C;
    }
    else {
      pcVar11 = ScaleFilterCols64_C;
    }
    iVar3 = libyuv::TestCpuFlag(0x40);
    pcVar4 = pcVar11;
    if (iVar3 != 0) {
      pcVar4 = ScaleFilterCols_SSSE3;
    }
    local_60 = pcVar11;
    if (uVar6 < 0x8000) {
      local_60 = pcVar4;
    }
  }
  uVar2 = local_88;
  local_78 = (uint8_t *)CONCAT44(local_78._4_4_,src_height);
  if (iVar1 < y) {
    y = iVar1;
  }
  iVar3 = y >> 0x10;
  local_68 = src_ptr + iVar3 * src_stride;
  uVar6 = (int)local_88 + 0x1fU & 0xffffffe0;
  local_40 = malloc((long)(int)((int)local_88 * 2 + 0x3eU | 0x3f));
  pcVar11 = local_60;
  local_70 = CONCAT44(local_70._4_4_,src_stride);
  uVar8 = (long)local_40 + 0x3fU & 0xffffffffffffffc0;
  (*local_60)(uVar8,local_68,uVar2 & 0xffffffff,x,dx);
  local_70 = (long)(int)local_70;
  lVar5 = 0;
  if (1 < (int)local_78) {
    lVar5 = local_70;
  }
  puVar10 = local_68 + lVar5;
  (*pcVar11)((long)(int)uVar6 + uVar8,puVar10,local_88,x,dx);
  local_78 = puVar10 + local_70;
  local_50 = iVar1 >> 0x10;
  local_38 = src_ptr + (int)local_70 * local_50;
  local_68 = (uint8_t *)(long)local_54;
  if (dst_height < 1) {
    dst_height = 0;
  }
  while (bVar12 = dst_height != 0, dst_height = dst_height + -1, bVar12) {
    if (y >> 0x10 != iVar3) {
      iVar9 = y >> 0x10;
      if (iVar1 < y) {
        local_78 = local_38;
        iVar9 = local_50;
        y = iVar1;
      }
      puVar10 = local_78;
      if (iVar9 != iVar3) {
        (*local_60)(uVar8,local_78,local_88,x,dx);
        uVar8 = uVar8 + (long)(int)uVar6;
        uVar6 = -uVar6;
        local_78 = puVar10 + local_70;
        iVar3 = iVar9;
      }
    }
    if (filtering == kFilterLinear) {
      lVar5 = 0;
      uVar7 = 0;
    }
    else {
      lVar5 = (long)(int)uVar6;
      uVar7 = y._1_1_;
    }
    (*local_48)(dst_ptr,uVar8,lVar5,local_88,uVar7);
    dst_ptr = dst_ptr + (long)local_68;
    y = y + dy;
  }
  free(local_40);
  return;
}

Assistant:

void ScalePlaneBilinearUp(int src_width,
                          int src_height,
                          int dst_width,
                          int dst_height,
                          int src_stride,
                          int dst_stride,
                          const uint8_t* src_ptr,
                          uint8_t* dst_ptr,
                          enum FilterMode filtering) {
  int j;
  // Initial source x/y coordinate and step values as 16.16 fixed point.
  int x = 0;
  int y = 0;
  int dx = 0;
  int dy = 0;
  const int max_y = (src_height - 1) << 16;
  void (*InterpolateRow)(uint8_t * dst_ptr, const uint8_t* src_ptr,
                         ptrdiff_t src_stride, int dst_width,
                         int source_y_fraction) = InterpolateRow_C;
  void (*ScaleFilterCols)(uint8_t * dst_ptr, const uint8_t* src_ptr,
                          int dst_width, int x, int dx) =
      filtering ? ScaleFilterCols_C : ScaleCols_C;
  ScaleSlope(src_width, src_height, dst_width, dst_height, filtering, &x, &y,
             &dx, &dy);
  src_width = Abs(src_width);

#if defined(HAS_INTERPOLATEROW_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3)) {
    InterpolateRow = InterpolateRow_Any_SSSE3;
    if (IS_ALIGNED(dst_width, 16)) {
      InterpolateRow = InterpolateRow_SSSE3;
    }
  }
#endif
#if defined(HAS_INTERPOLATEROW_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    InterpolateRow = InterpolateRow_Any_AVX2;
    if (IS_ALIGNED(dst_width, 32)) {
      InterpolateRow = InterpolateRow_AVX2;
    }
  }
#endif
#if defined(HAS_INTERPOLATEROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    InterpolateRow = InterpolateRow_Any_NEON;
    if (IS_ALIGNED(dst_width, 16)) {
      InterpolateRow = InterpolateRow_NEON;
    }
  }
#endif

  if (filtering && src_width >= 32768) {
    ScaleFilterCols = ScaleFilterCols64_C;
  }
#if defined(HAS_SCALEFILTERCOLS_SSSE3)
  if (filtering && TestCpuFlag(kCpuHasSSSE3) && src_width < 32768) {
    ScaleFilterCols = ScaleFilterCols_SSSE3;
  }
#endif
#if defined(HAS_SCALEFILTERCOLS_NEON)
  if (filtering && TestCpuFlag(kCpuHasNEON) && src_width < 32768) {
    ScaleFilterCols = ScaleFilterCols_Any_NEON;
    if (IS_ALIGNED(dst_width, 8)) {
      ScaleFilterCols = ScaleFilterCols_NEON;
    }
  }
#endif
#if defined(HAS_SCALEFILTERCOLS_MSA)
  if (filtering && TestCpuFlag(kCpuHasMSA) && src_width < 32768) {
    ScaleFilterCols = ScaleFilterCols_Any_MSA;
    if (IS_ALIGNED(dst_width, 16)) {
      ScaleFilterCols = ScaleFilterCols_MSA;
    }
  }
#endif
  if (!filtering && src_width * 2 == dst_width && x < 0x8000) {
    ScaleFilterCols = ScaleColsUp2_C;
#if defined(HAS_SCALECOLS_SSE2)
    if (TestCpuFlag(kCpuHasSSE2) && IS_ALIGNED(dst_width, 8)) {
      ScaleFilterCols = ScaleColsUp2_SSE2;
    }
#endif
#if defined(HAS_SCALECOLS_MMI)
    if (TestCpuFlag(kCpuHasMMI) && IS_ALIGNED(dst_width, 8)) {
      ScaleFilterCols = ScaleColsUp2_MMI;
    }
#endif
  }

  if (y > max_y) {
    y = max_y;
  }
  {
    int yi = y >> 16;
    const uint8_t* src = src_ptr + yi * src_stride;

    // Allocate 2 row buffers.
    const int kRowSize = (dst_width + 31) & ~31;
    align_buffer_64(row, kRowSize * 2);

    uint8_t* rowptr = row;
    int rowstride = kRowSize;
    int lasty = yi;

    ScaleFilterCols(rowptr, src, dst_width, x, dx);
    if (src_height > 1) {
      src += src_stride;
    }
    ScaleFilterCols(rowptr + rowstride, src, dst_width, x, dx);
    src += src_stride;

    for (j = 0; j < dst_height; ++j) {
      yi = y >> 16;
      if (yi != lasty) {
        if (y > max_y) {
          y = max_y;
          yi = y >> 16;
          src = src_ptr + yi * src_stride;
        }
        if (yi != lasty) {
          ScaleFilterCols(rowptr, src, dst_width, x, dx);
          rowptr += rowstride;
          rowstride = -rowstride;
          lasty = yi;
          src += src_stride;
        }
      }
      if (filtering == kFilterLinear) {
        InterpolateRow(dst_ptr, rowptr, 0, dst_width, 0);
      } else {
        int yf = (y >> 8) & 255;
        InterpolateRow(dst_ptr, rowptr, rowstride, dst_width, yf);
      }
      dst_ptr += dst_stride;
      y += dy;
    }
    free_aligned_buffer_64(row);
  }
}